

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_> *
__cxxabiv1::(anonymous_namespace)::
base_name<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
          (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
           *s)

{
  bool bVar1;
  malloc_alloc<char> *__a;
  size_type sVar2;
  malloc_alloc<char> *pmVar3;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_RDI;
  char *p0;
  uint c;
  char *pe;
  char *pf;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *__beg;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  char *in_stack_ffffffffffffffd8;
  malloc_alloc<char> *pmVar5;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_stack_ffffffffffffffe0;
  malloc_alloc<char> *pmVar6;
  
  __beg = in_RDI;
  bVar1 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::empty((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                   *)0x2065c5);
  if (bVar1) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
    if (bVar1) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(in_RDI,in_stack_ffffffffffffffa8);
      std::__cxx11::
      basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
      ::basic_string<__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (malloc_alloc<char> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                );
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
      if (bVar1) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::operator=(in_RDI,in_stack_ffffffffffffffa8);
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::basic_string<__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (malloc_alloc<char> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
        if (bVar1) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::operator=(in_RDI,in_stack_ffffffffffffffa8);
          std::__cxx11::
          basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
          ::basic_string<__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     (malloc_alloc<char> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        else {
          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
          if (bVar1) {
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
            ::operator=(in_RDI,in_stack_ffffffffffffffa8);
            std::__cxx11::
            basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
            ::basic_string<__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       (malloc_alloc<char> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          }
          else {
            __a = (malloc_alloc<char> *)
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                  ::data((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                          *)0x2066f5);
            pmVar6 = __a;
            sVar2 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    ::size(in_RSI);
            pmVar3 = __a + sVar2;
            if (pmVar3[-1] == (malloc_alloc<char>)0x3e) {
              iVar4 = 1;
              do {
                while( true ) {
                  pmVar5 = pmVar3;
                  pmVar3 = pmVar5 + -1;
                  if (pmVar3 == pmVar6) {
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    ::basic_string(in_RDI);
                    return __beg;
                  }
                  if (pmVar5[-2] == (malloc_alloc<char>)0x3c) break;
                  if (pmVar5[-2] == (malloc_alloc<char>)0x3e) {
                    iVar4 = iVar4 + 1;
                  }
                }
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
              pmVar3 = pmVar5 + -2;
            }
            do {
              pmVar3 = pmVar3 + -1;
              if (pmVar3 == pmVar6) break;
            } while (*pmVar3 != (malloc_alloc<char>)0x3a);
            std::__cxx11::
            basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
            ::basic_string<char_const*,void>
                      (in_stack_ffffffffffffffc0,(char *)__beg,(char *)in_RDI,__a);
          }
        }
      }
    }
  }
  return __beg;
}

Assistant:

String
base_name(String& s)
{
    if (s.empty())
        return s;
    if (s == "std::string")
    {
        s = "std::basic_string<char, std::char_traits<char>, std::allocator<char> >";
        return "basic_string";
    }
    if (s == "std::istream")
    {
        s = "std::basic_istream<char, std::char_traits<char> >";
        return "basic_istream";
    }
    if (s == "std::ostream")
    {
        s = "std::basic_ostream<char, std::char_traits<char> >";
        return "basic_ostream";
    }
    if (s == "std::iostream")
    {
        s = "std::basic_iostream<char, std::char_traits<char> >";
        return "basic_iostream";
    }
    const char* const pf = s.data();
    const char* pe = pf + s.size();
    if (pe[-1] == '>')
    {
        unsigned c = 1;
        while (true)
        {
            if (--pe == pf)
                return String();
            if (pe[-1] == '<')
            {
                if (--c == 0)
                {
                    --pe;
                    break;
                }
            }
            else if (pe[-1] == '>')
                ++c;
        }
    }
    const char* p0 = pe - 1;
    for (; p0 != pf; --p0)
    {
        if (*p0 == ':')
        {
            ++p0;
            break;
        }
    }
    return String(p0, pe);
}